

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
          (AssertionResult *__return_storage_ptr__,StrCaseEqHelper *this,char *expr1,char *expr2,
          char **val1,char **val2)

{
  bool bVar1;
  char **v;
  char **v_00;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = Compare(*(char **)expr2,*val1);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    PrintToString<char_const*>(&local_50,(iutest *)expr2,v);
    detail::ShowStringQuoted(&local_70,&local_50);
    PrintToString<char_const*>(&local_b0,(iutest *)val1,v_00);
    detail::ShowStringQuoted(&local_90,&local_b0);
    EqFailure(__return_storage_ptr__,(char *)this,expr1,&local_70,&local_90,true);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(
    const char* expr1, const char* expr2
        , const T1& val1, const T2& val2)
{
    if IUTEST_COND_LIKELY( Compare(val1, val2) )
    {
        return AssertionSuccess();
    }

    return EqFailure(expr1, expr2
        , detail::ShowStringQuoted(FormatForComparisonFailureMessage(val1, val2))
        , detail::ShowStringQuoted(FormatForComparisonFailureMessage(val2, val1))
        , true);
}